

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::usda::USDAReader::Impl::GetAsLayer(Impl *this,Layer *layer)

{
  ulong *puVar1;
  ulong primSpecIdx;
  bool bVar2;
  ostream *poVar3;
  string *args;
  ulong *puVar4;
  char *pcVar5;
  pointer pPVar6;
  string *name;
  ostringstream ss_e;
  allocator local_1f1;
  string *local_1f0;
  string local_1e8;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  if (layer == (Layer *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"GetAsLayer");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x56b);
    ::std::operator<<(poVar3," ");
    pcVar5 = "layer arg is nullptr.";
  }
  else {
    if (this->_primspec_invalidated != true) {
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear(&(layer->_prim_specs)._M_h);
      LayerMetas::operator=(&layer->_metas,&(this->_stage).stage_metas);
      puVar4 = (this->_toplevel_primspecs).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar1 = (this->_toplevel_primspecs).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_1f0 = &this->_err;
      do {
        if (puVar4 == puVar1) {
          this->_primspec_invalidated = true;
          return true;
        }
        primSpecIdx = *puVar4;
        pPVar6 = (this->_primspec_nodes).
                 super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(this->_primspec_nodes).
                           super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar6) / 0x5b8) <=
            primSpecIdx) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"GetAsLayer");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x57a);
          ::std::operator<<(poVar3," ");
          pcVar5 = "[Internal Error] out-of-bounds access.";
LAB_0011e3f8:
          poVar3 = ::std::operator<<((ostream *)local_1a8,pcVar5);
          ::std::operator<<(poVar3,"\n");
          goto LAB_0011e40f;
        }
        pPVar6 = pPVar6 + primSpecIdx;
        args = local_1f0;
        bVar2 = anon_unknown_1::ToPrimSpecRec
                          (primSpecIdx,&this->_primspec_nodes,&pPVar6->primSpec,local_1f0);
        if (!bVar2) {
          this->_primspec_invalidated = true;
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"GetAsLayer");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x586);
          ::std::operator<<(poVar3," ");
          pcVar5 = "Construct PrimSpec tree failed.";
          goto LAB_0011e3f8;
        }
        name = &(pPVar6->primSpec)._name;
        bVar2 = Layer::emplace_primspec
                          (layer,name,
                           &(this->_primspec_nodes).
                            super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
                            ._M_impl.super__Vector_impl_data._M_start[*puVar4].primSpec);
        puVar4 = puVar4 + 1;
      } while (bVar2);
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"GetAsLayer");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x58a);
      ::std::operator<<(poVar3," ");
      ::std::__cxx11::string::string
                (local_1c8,"Construct PrimSpec tree failed: PrimSpec.name = {}",&local_1f1);
      fmt::format<std::__cxx11::string>
                (&local_1e8,(fmt *)local_1c8,(string *)name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      poVar3 = ::std::operator<<((ostream *)local_1a8,(string *)&local_1e8);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
LAB_0011e40f:
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)local_1f0);
      ::std::__cxx11::string::_M_dispose();
      goto LAB_0011e439;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"GetAsLayer");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x56f);
    ::std::operator<<(poVar3," ");
    pcVar5 = 
    "PrimSpec data is invalid. USD data is not loaded or there was an error in earlier GetAsLayer call, or GetAsLayer was invoked multiple times."
    ;
  }
  poVar3 = ::std::operator<<((ostream *)local_1a8,pcVar5);
  ::std::operator<<(poVar3,"\n");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
LAB_0011e439:
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return false;
}

Assistant:

bool USDAReader::Impl::GetAsLayer(Layer *layer) {

  if (!layer) {
    PUSH_ERROR_AND_RETURN("layer arg is nullptr.");
  }

  if (_primspec_invalidated) {
    PUSH_ERROR_AND_RETURN("PrimSpec data is invalid. USD data is not loaded or there was an error in earlier GetAsLayer call, or GetAsLayer was invoked multiple times.");
  }

  layer->clear_primspecs();
  DCOUT("# of subLayers = " << _stage.metas().subLayers.size());
  layer->metas() = _stage.metas();

  for (const auto &idx : _toplevel_primspecs) {
    DCOUT("Toplevel primspec idx: " << std::to_string(idx));

    if (idx >= _primspec_nodes.size()) {
      PUSH_ERROR_AND_RETURN("[Internal Error] out-of-bounds access.");
    }

    auto &node = _primspec_nodes[idx];
    PrimSpec &primSpec = node.primSpec;

    DCOUT("primspec[" << idx << "].typeName = " << primSpec.typeName());
    DCOUT("primspec[" << idx << "].name = " << primSpec.name());
    DCOUT("root prim[" << idx << "].num_children = " << primSpec.children().size());

    if (!ToPrimSpecRec(idx, _primspec_nodes, /* inout */primSpec, &_err)) {
      _primspec_invalidated = true;
      PUSH_ERROR_AND_RETURN("Construct PrimSpec tree failed.");
    }

    if (!layer->emplace_primspec(primSpec.name(), std::move(_primspec_nodes[idx].primSpec))) {
      PUSH_ERROR_AND_RETURN(fmt::format("Construct PrimSpec tree failed: PrimSpec.name = {}", primSpec.name()));
    }
  }

  // NOTE: _toplevel_primspecs are destroyed(std::move'ed)
  _primspec_invalidated = true;

  return true;
}